

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O1

string * __thiscall
chaiscript::exception::eval_error::format_types_abi_cxx11_
          (string *__return_storage_ptr__,eval_error *this,Const_Proxy_Function *t_func,
          bool t_dot_notation,Dispatch_Engine *t_ss)

{
  int iVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Dynamic_Proxy_Function *this_01;
  Dynamic_Proxy_Function *this_02;
  AST_Node *pAVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  undefined7 in_register_00000009;
  long lVar5;
  char *__s;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_04;
  long lVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  string paramstr;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> types;
  stringstream ss;
  string local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1e0;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> local_1d8;
  eval_error *local_1c0;
  undefined1 local_1b8 [128];
  ios_base local_138 [264];
  
  lVar5 = *(long *)this;
  if (lVar5 != 0) {
    iVar1 = *(int *)(lVar5 + 0x20);
    Catch::clara::std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::vector
              (&local_1d8,
               (vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)(lVar5 + 8))
    ;
    paVar7 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar7;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    if (iVar1 == -1) {
      Catch::clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
      ::_M_replace(__return_storage_ptr__,0,0,"(...)",5);
      if ((char)t_func != '\0') {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1b8,"(Object).",__return_storage_ptr__);
        format_types_abi_cxx11_();
      }
    }
    else if ((ulong)(((long)local_1d8.
                            super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_1d8.
                            super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) <
             2) {
      Catch::clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
      ::_M_replace(__return_storage_ptr__,0,0,"()",2);
    }
    else {
      local_1e0 = paVar7;
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      local_1c0 = this;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1b8 + 0x10),"(",1);
      local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
      local_200._M_string_length = 0;
      local_200.field_2._M_allocated_capacity =
           local_200.field_2._M_allocated_capacity & 0xffffffffffffff00;
      if ((long)local_1d8.
                super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)local_1d8.
                super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
                _M_impl.super__Vector_impl_data._M_start != 0x18) {
        lVar5 = 1;
        lVar6 = 0x18;
        do {
          __s = "";
          if ((*(byte *)((long)&(local_1d8.
                                 super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_flags + lVar6) & 1)
              != 0) {
            __s = "const ";
          }
          Catch::clara::std::__cxx11::
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append(&local_200,__s);
          detail::Dispatch_Engine::get_type_name_abi_cxx11_
                    (&local_220,(Dispatch_Engine *)CONCAT71(in_register_00000009,t_dot_notation),
                     (Type_Info *)
                     ((long)&(local_1d8.
                              super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_type_info + lVar6));
          Catch::clara::std::__cxx11::
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (&local_200,local_220._M_dataplus._M_p,local_220._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_220._M_dataplus._M_p != &local_220.field_2) {
            operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
          }
          if ((lVar5 != 1 || (char)t_func != '\x01') ||
             (Catch::clara::std::__cxx11::
              basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                        (&local_200,").("),
             (long)local_1d8.
                   super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_1d8.
                   super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                   ._M_impl.super__Vector_impl_data._M_start == 0x30)) {
            Catch::clara::std::__cxx11::
            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&local_200,", ");
          }
          lVar5 = lVar5 + 1;
          lVar6 = lVar6 + 0x18;
        } while (lVar5 != ((long)local_1d8.
                                 super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_1d8.
                                 super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3) *
                          -0x5555555555555555);
      }
      Catch::clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
      ::substr(&local_220,&local_200,0,local_200._M_string_length - 2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b8 + 0x10),local_220._M_dataplus._M_p,local_220._M_string_length
                );
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p != &local_220.field_2) {
        operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
      }
      paVar7 = local_1e0;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1b8 + 0x10),")",1);
      std::__cxx11::stringbuf::str();
      Catch::clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
      ::operator=(__return_storage_ptr__,&local_220);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p != &local_220.field_2) {
        operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
      }
      this = local_1c0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p != &local_200.field_2) {
        operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base(local_138);
    }
    if (*(long *)this == 0) {
      this_01 = (Dynamic_Proxy_Function *)0x0;
    }
    else {
      this_01 = (Dynamic_Proxy_Function *)
                __dynamic_cast(*(long *)this,&dispatch::Proxy_Function_Base::typeinfo,
                               &dispatch::Dynamic_Proxy_Function::typeinfo,0);
    }
    if (this_01 == (Dynamic_Proxy_Function *)0x0) {
      this_04 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this_01 = (Dynamic_Proxy_Function *)0x0;
    }
    else {
      this_04 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this->field_0x8;
      if (this_04 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_04->_M_use_count = this_04->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_04->_M_use_count = this_04->_M_use_count + 1;
        }
      }
    }
    if ((this_01 != (Dynamic_Proxy_Function *)0x0) &&
       ((this_01->m_parsenode).super___shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)0x0)) {
      peVar2 = (this_01->m_guard).
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      this_00 = (this_01->m_guard).
                super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      local_1e0 = paVar7;
      if (peVar2 != (element_type *)0x0) {
        this_02 = (Dynamic_Proxy_Function *)
                  __dynamic_cast(peVar2,&dispatch::Proxy_Function_Base::typeinfo,
                                 &dispatch::Dynamic_Proxy_Function::typeinfo,0);
        this_03 = this_00;
        if (this_02 == (Dynamic_Proxy_Function *)0x0) {
          this_03 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        }
        if (this_02 != (Dynamic_Proxy_Function *)0x0 &&
            this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
            this_03 = this_00;
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
            this_03 = this_00;
          }
        }
        if ((this_02 != (Dynamic_Proxy_Function *)0x0) &&
           ((this_02->m_parsenode).
            super___shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0)) {
          pAVar3 = dispatch::Dynamic_Proxy_Function::get_parse_tree(this_02);
          AST_Node::pretty_print_abi_cxx11_(&local_220,pAVar3);
          pbVar4 = Catch::clara::std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                             (&local_220,0,0," : ",3);
          local_200._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
          paVar7 = &pbVar4->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_200._M_dataplus._M_p == paVar7) {
            local_200.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
            local_200.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
            local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
          }
          else {
            local_200.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
          }
          local_200._M_string_length = pbVar4->_M_string_length;
          (pbVar4->_M_dataplus)._M_p = (pointer)paVar7;
          pbVar4->_M_string_length = 0;
          (pbVar4->field_2)._M_local_buf[0] = '\0';
          Catch::clara::std::__cxx11::
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (__return_storage_ptr__,local_200._M_dataplus._M_p,local_200._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_200._M_dataplus._M_p != &local_200.field_2) {
            operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_220._M_dataplus._M_p != &local_220.field_2) {
            operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
          }
        }
        if (this_03 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_03);
        }
      }
      pAVar3 = dispatch::Dynamic_Proxy_Function::get_parse_tree(this_01);
      format_location<chaiscript::AST_Node>(&local_220,pAVar3);
      pbVar4 = Catch::clara::std::__cxx11::
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                         (&local_220,0,0,"\n          Defined at ",0x16);
      local_200._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
      paVar7 = &pbVar4->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p == paVar7) {
        local_200.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
        local_200.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
        local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
      }
      else {
        local_200.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
      }
      local_200._M_string_length = pbVar4->_M_string_length;
      (pbVar4->_M_dataplus)._M_p = (pointer)paVar7;
      pbVar4->_M_string_length = 0;
      (pbVar4->field_2)._M_local_buf[0] = '\0';
      Catch::clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
      ::_M_append(__return_storage_ptr__,local_200._M_dataplus._M_p,local_200._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p != &local_200.field_2) {
        operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p != &local_220.field_2) {
        operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
    }
    if (this_04 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_04);
    }
    if (local_1d8.super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1d8.
                      super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1d8.
                            super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1d8.
                            super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("t_func",
                "/workspace/llm4binary/github/license_c_cmakelists/ChaiScript[P]ChaiScript/include/chaiscript/language/chaiscript_common.hpp"
                ,0x18a,
                "static std::string chaiscript::exception::eval_error::format_types(const Const_Proxy_Function &, bool, const chaiscript::detail::Dispatch_Engine &)"
               );
}

Assistant:

static std::string format_types(const Const_Proxy_Function &t_func, bool t_dot_notation, const chaiscript::detail::Dispatch_Engine &t_ss) {
        assert(t_func);
        int arity = t_func->get_arity();
        std::vector<Type_Info> types = t_func->get_param_types();

        std::string retval;
        if (arity == -1) {
          retval = "(...)";
          if (t_dot_notation) {
            retval = "(Object)." + retval;
          }
        } else if (types.size() <= 1) {
          retval = "()";
        } else {
          std::stringstream ss;
          ss << "(";

          std::string paramstr;

          for (size_t index = 1; index != types.size(); ++index) {
            paramstr += (types[index].is_const() ? "const " : "");
            paramstr += t_ss.get_type_name(types[index]);

            if (index == 1 && t_dot_notation) {
              paramstr += ").(";
              if (types.size() == 2) {
                paramstr += ", ";
              }
            } else {
              paramstr += ", ";
            }
          }

          ss << paramstr.substr(0, paramstr.size() - 2);

          ss << ")";
          retval = ss.str();
        }

        std::shared_ptr<const dispatch::Dynamic_Proxy_Function> dynfun
            = std::dynamic_pointer_cast<const dispatch::Dynamic_Proxy_Function>(t_func);

        if (dynfun && dynfun->has_parse_tree()) {
          Proxy_Function f = dynfun->get_guard();

          if (f) {
            auto dynfunguard = std::dynamic_pointer_cast<const dispatch::Dynamic_Proxy_Function>(f);
            if (dynfunguard && dynfunguard->has_parse_tree()) {
              retval += " : " + format_guard(dynfunguard->get_parse_tree());
            }
          }

          retval += "\n          Defined at " + format_location(dynfun->get_parse_tree());
        }

        return retval;
      }